

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O1

void ncnn::conv_im2col_sgemm_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,int kernel_w,int kernel_h,int stride_w,
               int stride_h,Mat *_bias,vector<float,_std::allocator<float>_> *scale_dequant,
               Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  void *pvVar8;
  pointer pfVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int *piVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  uint _h;
  int iVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  char *pcVar29;
  int n_1;
  ulong uVar30;
  long lVar31;
  char *pcVar32;
  float *pfVar33;
  uint _w;
  int iVar34;
  ulong *puVar35;
  undefined1 *puVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  int iVar41;
  uint uVar42;
  float *pfVar43;
  uint uVar44;
  long lVar45;
  int n;
  int iVar46;
  long lVar47;
  long lVar48;
  float *pfVar49;
  int iVar50;
  float *pfVar51;
  undefined1 *puVar52;
  char *pcVar53;
  long lVar54;
  ulong uVar55;
  undefined1 auVar56 [16];
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar61 [64];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  int sum0 [4];
  Mat bottom_tm;
  int sum3 [4];
  int sum2 [4];
  int sum1 [4];
  Mat kernel_tm;
  Mat bottom_im2row;
  uint local_1e0;
  undefined1 local_1b8 [16];
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  long local_188;
  Mat *local_180;
  void *local_178;
  ulong local_170;
  undefined1 local_168 [64];
  size_t local_128;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [64];
  size_t local_a8;
  long local_98;
  void *local_90;
  pointer local_88;
  void *local_80;
  undefined1 local_78 [64];
  size_t local_38;
  
  iVar38 = bottom_blob->w;
  uVar44 = bottom_blob->c;
  iVar25 = top_blob->w;
  iVar50 = top_blob->h;
  pvVar5 = _kernel->data;
  local_178 = _bias->data;
  iVar19 = kernel_h * kernel_w;
  _w = uVar44 * iVar19;
  _h = iVar50 * iVar25;
  local_1a0 = (ulong)top_blob->c;
  local_38 = 0;
  local_78._0_8_ = (void *)0x0;
  local_78._8_4_ = 0;
  local_78._12_4_ = 0;
  local_78._16_8_ = 0;
  local_78._24_4_ = 0;
  local_78._32_8_ = (Allocator *)0x0;
  local_78._40_4_ = 0;
  local_78._44_4_ = 0;
  local_78._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_180 = top_blob;
  Mat::create((Mat *)local_78,_w,_h,1,opt->workspace_allocator);
  if (0 < iVar50) {
    iVar39 = 0;
    iVar37 = 0;
    iVar24 = 0;
    do {
      if (0 < iVar25) {
        iVar23 = 0;
        iVar34 = iVar39;
        do {
          if (0 < (int)uVar44) {
            uVar26 = 0;
            do {
              if (0 < kernel_h) {
                sVar6 = bottom_blob->cstep;
                sVar7 = bottom_blob->elemsize;
                pvVar8 = bottom_blob->data;
                iVar41 = 0;
                iVar46 = iVar34;
                do {
                  if (0 < kernel_w) {
                    uVar30 = 0;
                    do {
                      *(undefined1 *)(local_78._0_8_ + uVar30 + (long)iVar37) =
                           *(undefined1 *)
                            ((long)pvVar8 + (long)(iVar46 + (int)uVar30) + sVar6 * uVar26 * sVar7);
                      uVar30 = uVar30 + 1;
                    } while ((uint)kernel_w != uVar30);
                    iVar37 = iVar37 + (int)uVar30;
                  }
                  iVar41 = iVar41 + 1;
                  iVar46 = iVar46 + iVar38;
                } while (iVar41 != kernel_h);
              }
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar44);
          }
          iVar23 = iVar23 + 1;
          iVar34 = iVar34 + stride_w;
        } while (iVar23 != iVar25);
      }
      iVar24 = iVar24 + 1;
      iVar39 = iVar39 + stride_h * iVar38;
    } while (iVar24 != iVar50);
  }
  uVar20 = _h + 3;
  if (-1 < (int)_h) {
    uVar20 = _h;
  }
  local_128 = 0;
  local_168._0_8_ = (void *)0x0;
  local_168._8_4_ = 0;
  local_168._12_4_ = 0;
  local_168._16_8_ = 0;
  local_168._24_4_ = 0;
  local_168._32_8_ = (Allocator *)0x0;
  local_168._40_4_ = 0;
  local_168._44_4_ = 0;
  local_168._48_12_ = SUB1612((undefined1  [16])0x0,4);
  Mat::create((Mat *)local_168,iVar19 * 4,uVar44,_h + ((int)uVar20 >> 2) * -3,1,
              opt->workspace_allocator);
  local_198 = local_1a0;
  if (0 < (int)_h >> 2) {
    lVar45 = 1;
    lVar31 = 3;
    lVar27 = 2;
    lVar48 = 0;
    uVar26 = 0;
    do {
      lVar40 = (long)(int)local_78._44_4_;
      puVar52 = (undefined1 *)(local_128 * uVar26 * local_168._16_8_ + local_168._0_8_);
      if ((int)_w < 2) {
        lVar40 = local_78._16_8_ * lVar40;
        lVar47 = uVar26 * 4 * lVar40;
        lVar54 = (uVar26 * 4 + 1) * lVar40;
        lVar28 = (uVar26 * 4 + 2) * lVar40;
        lVar40 = (uVar26 * 4 + 3) * lVar40;
        uVar20 = 0;
      }
      else {
        lVar47 = local_78._16_8_ * lVar48 * lVar40;
        lVar54 = local_78._16_8_ * lVar45 * lVar40;
        lVar22 = local_78._16_8_ * lVar31 * lVar40;
        local_188 = local_78._16_8_ * lVar27 * lVar40;
        lVar40 = 0;
        do {
          puVar36 = puVar52;
          puVar52 = (undefined1 *)
                    (local_168._0_8_ + lVar40 * 4 + local_128 * local_168._16_8_ * uVar26);
          *puVar52 = *(undefined1 *)(local_78._0_8_ + lVar40 + lVar47);
          puVar52[1] = *(undefined1 *)(local_78._0_8_ + lVar40 + lVar47 + 1);
          puVar52[2] = *(undefined1 *)(local_78._0_8_ + lVar40 + lVar54);
          puVar52[3] = *(undefined1 *)(local_78._0_8_ + lVar40 + lVar54 + 1);
          puVar52[4] = *(undefined1 *)(local_78._0_8_ + lVar40 + local_188);
          puVar52[5] = *(undefined1 *)(local_78._0_8_ + lVar40 + local_188 + 1);
          puVar52[6] = *(undefined1 *)(local_78._0_8_ + lVar40 + lVar22);
          puVar52[7] = *(undefined1 *)(local_78._0_8_ + lVar40 + lVar22 + 1);
          lVar28 = lVar40 + 2;
          iVar38 = (int)lVar40;
          lVar40 = lVar28;
          puVar52 = puVar52 + 8;
        } while (iVar38 + 3 < (int)_w);
        puVar52 = puVar36 + 8;
        lVar47 = lVar47 + lVar28;
        lVar54 = lVar54 + lVar28;
        lVar40 = lVar22 + lVar28;
        lVar28 = local_188 + lVar28;
        uVar20 = _w & 0xfffffffe;
      }
      if ((int)uVar20 < (int)_w) {
        lVar22 = 0;
        do {
          puVar52[lVar22 * 4] = *(undefined1 *)(local_78._0_8_ + lVar22 + lVar47);
          puVar52[lVar22 * 4 + 1] = *(undefined1 *)(local_78._0_8_ + lVar22 + lVar54);
          puVar52[lVar22 * 4 + 2] = *(undefined1 *)(local_78._0_8_ + lVar22 + lVar28);
          puVar52[lVar22 * 4 + 3] = *(undefined1 *)(local_78._0_8_ + lVar22 + lVar40);
          lVar22 = lVar22 + 1;
        } while (_w - uVar20 != (int)lVar22);
      }
      uVar26 = uVar26 + 1;
      lVar48 = lVar48 + 4;
      lVar45 = lVar45 + 4;
      lVar31 = lVar31 + 4;
      lVar27 = lVar27 + 4;
    } while (uVar26 != (uint)((int)_h >> 2));
  }
  if ((_h & 0xfffffffc) != _h) {
    lVar27 = (long)(int)(_h & 0xfffffffc);
    do {
      puVar52 = (undefined1 *)((int)local_78._44_4_ * lVar27 * local_78._16_8_ + local_78._0_8_);
      uVar20 = (uint)lVar27;
      uVar42 = uVar20 + 3;
      if (-1 < (int)uVar20) {
        uVar42 = uVar20;
      }
      puVar36 = (undefined1 *)
                ((long)(int)(((int)uVar42 >> 2) + (uVar20 - (uVar42 & 0xfffffffc))) * local_128 *
                 local_168._16_8_ + local_168._0_8_);
      if ((int)_w < 2) {
        uVar20 = 0;
      }
      else {
        iVar38 = 1;
        do {
          *puVar36 = *puVar52;
          puVar36[1] = puVar52[1];
          puVar36 = puVar36 + 2;
          puVar52 = puVar52 + 2;
          iVar38 = iVar38 + 2;
          uVar20 = _w & 0xfffffffe;
        } while (iVar38 < (int)_w);
      }
      if ((int)uVar20 < (int)_w) {
        lVar31 = 0;
        do {
          puVar36[lVar31] = puVar52[lVar31];
          lVar31 = lVar31 + 1;
        } while (_w - uVar20 != (int)lVar31);
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 < (int)_h);
  }
  uVar20 = (uint)local_1a0;
  uVar42 = uVar20 + 3;
  if (-1 < (int)uVar20) {
    uVar42 = uVar20;
  }
  uVar21 = uVar20 + 3;
  if (-1 < (int)uVar20) {
    uVar21 = uVar20;
  }
  local_a8 = 0;
  local_e8._0_8_ = (void *)0x0;
  local_e8._8_4_ = 0;
  local_e8._12_4_ = 0;
  local_e8._16_8_ = 0;
  local_e8._24_4_ = 0;
  local_e8._32_8_ = (Allocator *)0x0;
  local_e8._40_4_ = 0;
  local_e8._44_4_ = 0;
  local_e8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  Mat::create((Mat *)local_e8,iVar19 * 4,uVar44,
              (uVar20 - (uVar21 & 0xfffffffc)) + ((int)uVar42 >> 2),1,opt->workspace_allocator);
  uVar20 = (int)uVar20 >> 2;
  local_170 = (ulong)uVar20;
  local_198 = local_198 & 0xfffffffffffffffc;
  if (0 < (int)uVar20) {
    iVar24 = uVar44 * iVar19;
    iVar50 = kernel_h * uVar44 * kernel_w;
    iVar25 = iVar50 * 3;
    iVar38 = iVar50 * 4;
    iVar50 = iVar50 * 2;
    iVar39 = 0;
    uVar26 = 0;
    uVar42 = _w;
    do {
      puVar52 = (undefined1 *)(local_a8 * uVar26 * local_e8._16_8_ + local_e8._0_8_);
      if ((int)_w < 2) {
        iVar37 = (int)uVar26;
        lVar27 = (long)((iVar37 * 4 + 3) * iVar24);
        lVar31 = (long)((iVar37 * 4 + 2) * iVar24);
        lVar45 = (long)((iVar37 * 4 + 1) * iVar24);
        lVar48 = (long)(iVar37 * 4 * iVar24);
        uVar21 = 0;
      }
      else {
        lVar27 = 0;
        do {
          puVar36 = puVar52;
          puVar52 = (undefined1 *)
                    (local_e8._0_8_ + lVar27 * 4 + local_a8 * local_e8._16_8_ * uVar26);
          *puVar52 = *(undefined1 *)((long)pvVar5 + lVar27 + iVar39);
          puVar52[1] = *(undefined1 *)((long)pvVar5 + lVar27 + (long)iVar39 + 1);
          puVar52[2] = *(undefined1 *)((long)pvVar5 + lVar27 + (int)uVar42);
          puVar52[3] = *(undefined1 *)((long)pvVar5 + lVar27 + (long)(int)uVar42 + 1);
          puVar52[4] = *(undefined1 *)((long)pvVar5 + lVar27 + iVar50);
          puVar52[5] = *(undefined1 *)((long)pvVar5 + lVar27 + (long)iVar50 + 1);
          puVar52[6] = *(undefined1 *)((long)pvVar5 + lVar27 + iVar25);
          puVar52[7] = *(undefined1 *)((long)pvVar5 + lVar27 + (long)iVar25 + 1);
          lVar48 = lVar27 + 2;
          iVar37 = (int)lVar27;
          lVar27 = lVar48;
          puVar52 = puVar52 + 8;
        } while (iVar37 + 3 < (int)_w);
        puVar52 = puVar36 + 8;
        lVar27 = lVar48 + iVar25;
        lVar31 = lVar48 + iVar50;
        lVar45 = lVar48 + (int)uVar42;
        lVar48 = lVar48 + iVar39;
        uVar21 = _w & 0xfffffffe;
      }
      if ((int)uVar21 < (int)_w) {
        lVar40 = 0;
        do {
          puVar52[lVar40 * 4] = *(undefined1 *)((long)pvVar5 + lVar40 + lVar48);
          puVar52[lVar40 * 4 + 1] = *(undefined1 *)((long)pvVar5 + lVar40 + lVar45);
          puVar52[lVar40 * 4 + 2] = *(undefined1 *)((long)pvVar5 + lVar40 + lVar31);
          puVar52[lVar40 * 4 + 3] = *(undefined1 *)((long)pvVar5 + lVar40 + lVar27);
          lVar40 = lVar40 + 1;
        } while (_w - uVar21 != (int)lVar40);
      }
      uVar26 = uVar26 + 1;
      iVar25 = iVar25 + iVar38;
      iVar50 = iVar50 + iVar38;
      uVar42 = uVar42 + iVar38;
      iVar39 = iVar39 + iVar38;
    } while (uVar26 != local_170);
  }
  if ((int)local_198 != (int)local_1a0) {
    uVar26 = local_198;
    do {
      uVar42 = (uint)uVar26;
      uVar21 = uVar42 + 3;
      if (-1 < (int)uVar42) {
        uVar21 = uVar42;
      }
      puVar52 = (undefined1 *)
                ((long)(int)(((int)uVar21 >> 2) + (uVar42 - (uVar21 & 0xfffffffc))) * local_a8 *
                 local_e8._16_8_ + local_e8._0_8_);
      puVar36 = (undefined1 *)((long)(int)(uVar44 * iVar19 * uVar42) + (long)pvVar5);
      if ((int)_w < 2) {
        uVar42 = 0;
      }
      else {
        iVar38 = 1;
        do {
          *puVar52 = *puVar36;
          puVar52[1] = puVar36[1];
          puVar52 = puVar52 + 2;
          puVar36 = puVar36 + 2;
          iVar38 = iVar38 + 2;
          uVar42 = _w & 0xfffffffe;
        } while (iVar38 < (int)_w);
      }
      if ((int)uVar42 < (int)_w) {
        lVar27 = 0;
        do {
          puVar52[lVar27] = puVar36[lVar27];
          lVar27 = lVar27 + 1;
        } while (_w - uVar42 != (int)lVar27);
      }
      uVar26 = uVar26 + 1;
    } while ((long)uVar26 < (long)local_1a0);
  }
  if (0 < (int)uVar20) {
    local_88 = (scale_dequant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_90 = local_180->data;
    local_1e0 = _w & 0xfffffffe;
    local_98 = local_180->cstep * local_180->elemsize;
    auVar64 = ZEXT464(0x6040200);
    uVar26 = 0;
    do {
      local_190 = uVar26;
      uVar26 = local_190 * 4;
      fVar60 = 0.0;
      fVar57 = 0.0;
      if (local_178 != (void *)0x0) {
        fVar57 = *(float *)((long)local_178 + local_190 * 0x10);
        fVar60 = *(float *)((long)local_178 + local_190 * 0x10 + 4);
      }
      auVar61 = ZEXT1664(ZEXT816(0) << 0x40);
      fVar62 = 0.0;
      if (local_178 != (void *)0x0) {
        fVar62 = *(float *)((long)local_178 + local_190 * 0x10 + 8);
        auVar61 = ZEXT464(*(uint *)((long)local_178 + local_190 * 0x10 + 0xc));
      }
      fVar58 = auVar61._0_4_;
      pfVar43 = (float *)(local_98 * uVar26 + (long)local_90);
      pfVar49 = (float *)((uVar26 | 1) * local_98 + (long)local_90);
      pfVar51 = (float *)((uVar26 | 2) * local_98 + (long)local_90);
      pfVar33 = (float *)((uVar26 | 3) * local_98 + (long)local_90);
      uVar26 = 0;
      fVar1 = local_88[local_190 * 4];
      fVar2 = local_88[local_190 * 4 + 1];
      fVar3 = local_88[local_190 * 4 + 2];
      fVar4 = local_88[local_190 * 4 + 3];
      fVar59 = fVar58;
      if (3 < (int)_h) {
        pcVar32 = (char *)(local_a8 * local_190 * local_e8._16_8_ + local_e8._0_8_);
        local_188 = CONCAT44(local_188._4_4_,fVar62);
        local_80 = (void *)local_168._0_8_;
        uVar30 = 0;
        do {
          puVar35 = (ulong *)((uVar30 >> 2) * local_128 * local_168._16_8_ + local_168._0_8_);
          uVar44 = 0;
          local_1b8 = (undefined1  [16])0x0;
          local_f8 = (undefined1  [16])0x0;
          local_108 = (undefined1  [16])0x0;
          local_118 = (undefined1  [16])0x0;
          pcVar29 = pcVar32;
          if (1 < (int)_w) {
            auVar67 = ZEXT1664((undefined1  [16])0x0);
            auVar61 = ZEXT1664((undefined1  [16])0x0);
            local_108 = (undefined1  [16])0x0;
            iVar38 = 1;
            auVar66 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar11 = vpshufd_avx(ZEXT416((uint)(int)*pcVar29),0);
              auVar65 = vpshufd_avx(ZEXT416((uint)(int)pcVar29[1]),0);
              auVar12 = vpshufd_avx(ZEXT416((uint)(int)pcVar29[2]),0);
              auVar13 = vpshufd_avx(ZEXT416((uint)(int)pcVar29[3]),0);
              auVar14 = vpshufd_avx(ZEXT416((uint)(int)pcVar29[4]),0);
              auVar15 = vpshufd_avx(ZEXT416((uint)(int)pcVar29[5]),0);
              auVar16 = vpshufd_avx(ZEXT416((uint)(int)pcVar29[6]),0);
              auVar17 = vpshufd_avx(ZEXT416((uint)(int)pcVar29[7]),0);
              auVar63._8_8_ = 0;
              auVar63._0_8_ = *puVar35;
              auVar56 = vpshufb_avx(auVar63,auVar64._0_16_);
              auVar10 = vpshufb_avx(auVar63,SUB6416(ZEXT464(0x7050301),0));
              auVar63 = vpmovsxbd_avx(auVar56);
              auVar56 = vpmulld_avx(auVar11,auVar63);
              auVar56 = vpaddd_avx(auVar56,auVar67._0_16_);
              auVar10 = vpmovsxbd_avx(auVar10);
              auVar11 = vpmulld_avx(auVar65,auVar10);
              local_1b8 = vpaddd_avx(auVar56,auVar11);
              auVar67 = ZEXT1664(local_1b8);
              auVar56 = vpmulld_avx(auVar12,auVar63);
              auVar56 = vpaddd_avx(auVar61._0_16_,auVar56);
              auVar11 = vpmulld_avx(auVar13,auVar10);
              local_f8 = vpaddd_avx(auVar11,auVar56);
              auVar61 = ZEXT1664(local_f8);
              auVar56 = vpmulld_avx(auVar14,auVar63);
              auVar56 = vpaddd_avx(local_108,auVar56);
              auVar11 = vpmulld_avx(auVar15,auVar10);
              local_108 = vpaddd_avx(auVar11,auVar56);
              auVar56 = vpmulld_avx(auVar16,auVar63);
              auVar64 = ZEXT1664(auVar64._0_16_);
              auVar56 = vpaddd_avx(auVar66._0_16_,auVar56);
              auVar63 = vpmulld_avx(auVar17,auVar10);
              local_118 = vpaddd_avx(auVar63,auVar56);
              auVar66 = ZEXT1664(local_118);
              pcVar29 = pcVar29 + 8;
              puVar35 = puVar35 + 1;
              iVar38 = iVar38 + 2;
            } while (iVar38 < (int)_w);
            auVar61 = ZEXT464((uint)fVar58);
            uVar44 = local_1e0;
          }
          fVar59 = auVar61._0_4_;
          if ((int)uVar44 < (int)_w) {
            do {
              lVar27 = 0;
              do {
                iVar38 = (int)*(char *)((long)puVar35 + lVar27);
                *(int *)(local_1b8 + lVar27 * 4) =
                     *(int *)(local_1b8 + lVar27 * 4) + *pcVar29 * iVar38;
                *(int *)(local_f8 + lVar27 * 4) =
                     *(int *)(local_f8 + lVar27 * 4) + pcVar29[1] * iVar38;
                *(int *)(local_108 + lVar27 * 4) =
                     *(int *)(local_108 + lVar27 * 4) + pcVar29[2] * iVar38;
                *(int *)(local_118 + lVar27 * 4) =
                     *(int *)(local_118 + lVar27 * 4) + pcVar29[3] * iVar38;
                lVar27 = lVar27 + 1;
              } while (lVar27 != 4);
              pcVar29 = pcVar29 + 4;
              puVar35 = (ulong *)((long)puVar35 + 4);
              uVar44 = uVar44 + 1;
            } while (uVar44 != _w);
          }
          lVar27 = 0;
          do {
            *(float *)((long)pfVar43 + lVar27) =
                 fVar1 * (float)*(int *)(local_1b8 + lVar27) + fVar57;
            *(float *)((long)pfVar49 + lVar27) = fVar2 * (float)*(int *)(local_f8 + lVar27) + fVar60
            ;
            *(float *)((long)pfVar51 + lVar27) =
                 fVar3 * (float)*(int *)(local_108 + lVar27) + fVar62;
            *(float *)((long)pfVar33 + lVar27) =
                 fVar4 * (float)*(int *)(local_118 + lVar27) + fVar59;
            lVar27 = lVar27 + 4;
          } while (lVar27 != 0x10);
          pfVar43 = pfVar43 + 4;
          pfVar49 = pfVar49 + 4;
          pfVar51 = pfVar51 + 4;
          pfVar33 = pfVar33 + 4;
          uVar26 = uVar30 + 4;
          uVar55 = uVar30 + 7;
          uVar30 = uVar26;
        } while (uVar55 < _h);
      }
      if ((int)uVar26 < (int)_h) {
        pcVar32 = (char *)(local_a8 * local_190 * local_e8._16_8_ + local_e8._0_8_);
        do {
          pcVar53 = (char *)(local_128 * local_168._16_8_ *
                             (ulong)(((uint)uVar26 & 3) + ((uint)(uVar26 >> 2) & 0x3fffffff)) +
                            local_168._0_8_);
          iVar38 = 0;
          pcVar29 = pcVar32;
          if ((int)_w < 2) {
            iVar50 = 0;
            iVar19 = 0;
            iVar25 = 0;
            uVar44 = 0;
          }
          else {
            iVar25 = 0;
            iVar24 = 1;
            iVar19 = 0;
            iVar50 = 0;
            iVar38 = 0;
            do {
              iVar37 = (int)*pcVar53;
              iVar39 = (int)pcVar53[1];
              iVar38 = pcVar29[1] * iVar39 + *pcVar29 * iVar37 + iVar38;
              iVar50 = pcVar29[3] * iVar39 + pcVar29[2] * iVar37 + iVar50;
              iVar19 = pcVar29[5] * iVar39 + pcVar29[4] * iVar37 + iVar19;
              iVar25 = pcVar29[7] * iVar39 + pcVar29[6] * iVar37 + iVar25;
              pcVar29 = pcVar29 + 8;
              pcVar53 = pcVar53 + 2;
              iVar24 = iVar24 + 2;
              uVar44 = local_1e0;
            } while (iVar24 < (int)_w);
          }
          if ((int)uVar44 < (int)_w) {
            lVar27 = 0;
            do {
              iVar24 = (int)pcVar53[lVar27];
              iVar38 = iVar38 + pcVar29[lVar27 * 4] * iVar24;
              iVar50 = iVar50 + pcVar29[lVar27 * 4 + 1] * iVar24;
              iVar19 = iVar19 + pcVar29[lVar27 * 4 + 2] * iVar24;
              iVar25 = iVar25 + pcVar29[lVar27 * 4 + 3] * iVar24;
              lVar27 = lVar27 + 1;
            } while (_w - uVar44 != (int)lVar27);
          }
          *pfVar43 = fVar1 * (float)iVar38 + fVar57;
          *pfVar49 = fVar2 * (float)iVar50 + fVar60;
          *pfVar51 = fVar3 * (float)iVar19 + fVar62;
          *pfVar33 = fVar4 * (float)iVar25 + fVar59;
          pfVar43 = pfVar43 + 1;
          pfVar49 = pfVar49 + 1;
          pfVar51 = pfVar51 + 1;
          pfVar33 = pfVar33 + 1;
          uVar44 = (uint)uVar26 + 1;
          uVar26 = (ulong)uVar44;
        } while (uVar44 != _h);
      }
      uVar26 = local_190 + 1;
    } while (local_190 + 1 != local_170);
  }
  if ((int)local_198 != (int)local_1a0) {
    pvVar5 = local_180->data;
    sVar6 = local_180->cstep;
    pfVar9 = (scale_dequant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar27 = (long)(int)local_198;
    sVar7 = local_180->elemsize;
    do {
      if (local_178 == (void *)0x0) {
        auVar56 = ZEXT816(0) << 0x40;
      }
      else {
        auVar56 = ZEXT416(*(uint *)((long)local_178 + lVar27 * 4));
      }
      pfVar33 = (float *)(sVar6 * sVar7 * lVar27 + (long)pvVar5);
      uVar26 = 0;
      fVar57 = pfVar9[lVar27];
      uVar44 = (uint)lVar27;
      if (3 < (int)_h) {
        uVar20 = uVar44 + 3;
        if (-1 < (int)uVar44) {
          uVar20 = uVar44;
        }
        pcVar32 = (char *)((long)(int)(((int)uVar20 >> 2) + (uVar44 - (uVar20 & 0xfffffffc))) *
                           local_a8 * local_e8._16_8_ + local_e8._0_8_);
        auVar63 = vshufps_avx(ZEXT416((uint)fVar57),ZEXT416((uint)fVar57),0);
        auVar10 = vshufps_avx(auVar56,auVar56,0);
        uVar30 = 0;
        do {
          puVar35 = (ulong *)((uVar30 >> 2) * local_128 * local_168._16_8_ + local_168._0_8_);
          uVar20 = 0;
          local_1b8 = ZEXT816(0);
          pcVar29 = pcVar32;
          if (1 < (int)_w) {
            iVar38 = 1;
            do {
              auVar12 = vpshufd_avx(ZEXT416((uint)(int)*pcVar29),0);
              auVar13 = vpshufd_avx(ZEXT416((uint)(int)pcVar29[1]),0);
              auVar65._8_8_ = 0;
              auVar65._0_8_ = *puVar35;
              auVar11 = vpshufb_avx(auVar65,SUB6416(ZEXT464(0x6040200),0));
              auVar65 = vpshufb_avx(auVar65,SUB6416(ZEXT464(0x7050301),0));
              auVar11 = vpmovsxbd_avx(auVar11);
              auVar11 = vpmulld_avx(auVar12,auVar11);
              auVar11 = vpaddd_avx(auVar11,local_1b8);
              auVar65 = vpmovsxbd_avx(auVar65);
              auVar65 = vpmulld_avx(auVar13,auVar65);
              local_1b8 = vpaddd_avx(auVar65,auVar11);
              pcVar29 = pcVar29 + 2;
              puVar35 = puVar35 + 1;
              iVar38 = iVar38 + 2;
            } while (iVar38 < (int)_w);
            uVar20 = _w & 0xfffffffe;
          }
          if ((int)uVar20 < (int)_w) {
            do {
              lVar31 = 0;
              do {
                *(int *)(local_1b8 + lVar31 * 4) =
                     *(int *)(local_1b8 + lVar31 * 4) +
                     (int)*(char *)((long)puVar35 + lVar31) * (int)*pcVar29;
                lVar31 = lVar31 + 1;
              } while (lVar31 != 4);
              pcVar29 = pcVar29 + 1;
              puVar35 = (ulong *)((long)puVar35 + 4);
              uVar20 = uVar20 + 1;
            } while (uVar20 != _w);
          }
          auVar11 = vcvtdq2ps_avx(local_1b8);
          *pfVar33 = auVar63._0_4_ * auVar11._0_4_ + auVar10._0_4_;
          pfVar33[1] = auVar63._4_4_ * auVar11._4_4_ + auVar10._4_4_;
          pfVar33[2] = auVar63._8_4_ * auVar11._8_4_ + auVar10._8_4_;
          pfVar33[3] = auVar63._12_4_ * auVar11._12_4_ + auVar10._12_4_;
          pfVar33 = pfVar33 + 4;
          uVar26 = uVar30 + 4;
          uVar55 = uVar30 + 7;
          uVar30 = uVar26;
        } while (uVar55 < _h);
      }
      if ((int)uVar26 < (int)_h) {
        uVar20 = uVar44 + 3;
        if (-1 < (int)uVar44) {
          uVar20 = uVar44;
        }
        do {
          if ((int)_w < 1) {
            fVar60 = 0.0;
          }
          else {
            lVar31 = 0;
            iVar38 = 0;
            do {
              iVar38 = iVar38 + (int)*(char *)(local_168._0_8_ +
                                              lVar31 + local_128 * local_168._16_8_ *
                                                       (ulong)(((uint)uVar26 & 3) +
                                                              ((uint)(uVar26 >> 2) & 0x3fffffff))) *
                                (int)*(char *)(local_e8._0_8_ +
                                              lVar31 + (long)(int)(((int)uVar20 >> 2) +
                                                                  (uVar44 - (uVar20 & 0xfffffffc)))
                                                       * local_a8 * local_e8._16_8_);
              lVar31 = lVar31 + 1;
            } while (_w != (uint)lVar31);
            fVar60 = (float)iVar38;
          }
          *pfVar33 = fVar57 * fVar60 + auVar56._0_4_;
          pfVar33 = pfVar33 + 1;
          uVar42 = (uint)uVar26 + 1;
          uVar26 = (ulong)uVar42;
        } while (uVar42 != _h);
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 < (long)local_1a0);
  }
  piVar18 = (int *)CONCAT44(local_e8._12_4_,local_e8._8_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if ((Allocator *)local_e8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_e8._0_8_ != (void *)0x0) {
          free((void *)local_e8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_e8._32_8_)[3])();
      }
    }
  }
  piVar18 = (int *)CONCAT44(local_168._12_4_,local_168._8_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if ((Allocator *)local_168._32_8_ == (Allocator *)0x0) {
        if ((void *)local_168._0_8_ != (void *)0x0) {
          free((void *)local_168._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_168._32_8_)[3])();
      }
    }
  }
  piVar18 = (int *)CONCAT44(local_78._12_4_,local_78._8_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if ((Allocator *)local_78._32_8_ == (Allocator *)0x0) {
        if ((void *)local_78._0_8_ != (void *)0x0) {
          free((void *)local_78._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_78._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_int8_dequant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel,
        const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Mat& _bias, std::vector<float> scale_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    // im2row
    Mat bottom_im2row(kernel_h * kernel_w * inch, outw * outh, 1UL, opt.workspace_allocator);
    {
        signed char* ret = (signed char*)bottom_im2row;
        int retID = 0;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                for (int p = 0; p < inch; p++)
                {
                    const signed char* input = bottom_blob.channel(p);
                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }
                }
            }
        }
    }

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // int M = outch;  // outch
    int N = outw * outh;                // outsize or out stride
    int K = kernel_w * kernel_h * inch; // ksize * inch

    // bottom_im2row memory packed 4 x 4
    Mat bottom_tm(4 * kernel_size, inch, out_size / 4 + out_size % 4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = ii * 4;

            const signed char* img0 = bottom_im2row.row<signed char>(i);
            const signed char* img1 = bottom_im2row.row<signed char>(i + 1);
            const signed char* img2 = bottom_im2row.row<signed char>(i + 2);
            const signed char* img3 = bottom_im2row.row<signed char>(i + 3);

            signed char* tmpptr = bottom_tm.channel(i / 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q = q + 2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img1[0];
                tmpptr[3] = img1[1];
                tmpptr[4] = img2[0];
                tmpptr[5] = img2[1];
                tmpptr[6] = img3[0];
                tmpptr[7] = img3[1];

                tmpptr += 8;
                img0 += 2;
                img1 += 2;
                img2 += 2;
                img3 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img1[0];
                tmpptr[2] = img2[0];
                tmpptr[3] = img3[0];

                tmpptr += 4;
                img0 += 1;
                img1 += 1;
                img2 += 1;
                img3 += 1;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < out_size; i++)
        {
            const signed char* img0 = bottom_im2row.row<signed char>(i);

            signed char* tmpptr = bottom_tm.channel(i / 4 + i % 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q = q + 2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];

                tmpptr += 2;
                img0 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += 1;
            }
        }
    }

    // kernel memory packed 4 x 4
    Mat kernel_tm(4 * kernel_size, inch, outch / 4 + outch % 4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int p = pp * 4;

            const signed char* k0 = kernel + (p + 0) * inch * kernel_size;
            const signed char* k1 = kernel + (p + 1) * inch * kernel_size;
            const signed char* k2 = kernel + (p + 2) * inch * kernel_size;
            const signed char* k3 = kernel + (p + 3) * inch * kernel_size;

            signed char* ktmp = kernel_tm.channel(p / 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q += 2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp[2] = k1[0];
                ktmp[3] = k1[1];
                ktmp[4] = k2[0];
                ktmp[5] = k2[1];
                ktmp[6] = k3[0];
                ktmp[7] = k3[1];

                ktmp += 8;

                k0 += 2;
                k1 += 2;
                k2 += 2;
                k3 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k1[0];
                ktmp[2] = k2[0];
                ktmp[3] = k3[0];
                ktmp += 4;

                k0 += 1;
                k1 += 1;
                k2 += 1;
                k3 += 1;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = remain_outch_start; p < outch; p++)
        {
            const signed char* k0 = kernel + (p + 0) * inch * kernel_size;

            signed char* ktmp = kernel_tm.channel(p / 4 + p % 4);

            int q = 0;
            for (; q + 1 < inch * kernel_size; q = q + 2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp += 2;
                k0 += 2;
            }

            for (; q < inch * kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp++;
                k0++;
            }
        }
    }

    // 4x4
    // sgemm(int M, int N, int K, float* A, float* B, float* C)
    {
        // int M = outch;  // outch
        // int N = outw * outh; // outsize or out stride
        // int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int i = pp * 4;

            const float bias0 = bias ? bias[i] : 0.f;
            const float bias1 = bias ? bias[i + 1] : 0.f;
            const float bias2 = bias ? bias[i + 2] : 0.f;
            const float bias3 = bias ? bias[i + 3] : 0.f;

            const float scale_dequant0 = scale_dequant[i];
            const float scale_dequant1 = scale_dequant[i + 1];
            const float scale_dequant2 = scale_dequant[i + 2];
            const float scale_dequant3 = scale_dequant[i + 3];

            float* output0 = top_blob.channel(i);
            float* output1 = top_blob.channel(i + 1);
            float* output2 = top_blob.channel(i + 2);
            float* output3 = top_blob.channel(i + 3);

            int j = 0;
            for (; j + 3 < N; j = j + 4)
            {
                signed char* vb = bottom_tm.channel(j / 4);
                signed char* va = kernel_tm.channel(i / 4);

                int sum0[4] = {0};
                int sum1[4] = {0};
                int sum2[4] = {0};
                int sum3[4] = {0};

                int k = 0;

                for (; k + 1 < K; k = k + 2)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[2 * n]; // k0
                        sum0[n] += (int)va[1] * vb[2 * n + 1];

                        sum1[n] += (int)va[2] * vb[2 * n]; // k1
                        sum1[n] += (int)va[3] * vb[2 * n + 1];

                        sum2[n] += (int)va[4] * vb[2 * n]; // k2
                        sum2[n] += (int)va[5] * vb[2 * n + 1];

                        sum3[n] += (int)va[6] * vb[2 * n]; // k3
                        sum3[n] += (int)va[7] * vb[2 * n + 1];
                    }

                    va += 8;
                    vb += 8;
                }

                for (; k < K; k++)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[n];
                        sum1[n] += (int)va[1] * vb[n];
                        sum2[n] += (int)va[2] * vb[n];
                        sum3[n] += (int)va[3] * vb[n];
                    }

                    va += 4;
                    vb += 4;
                }

                for (int n = 0; n < 4; n++)
                {
                    output0[n] = (float)sum0[n] * scale_dequant0 + bias0;
                    output1[n] = (float)sum1[n] * scale_dequant1 + bias1;
                    output2[n] = (float)sum2[n] * scale_dequant2 + bias2;
                    output3[n] = (float)sum3[n] * scale_dequant3 + bias3;
                }
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j < N; j++)
            {
                int sum0 = 0;
                int sum1 = 0;
                int sum2 = 0;
                int sum3 = 0;

                signed char* vb = bottom_tm.channel(j / 4 + j % 4);
                signed char* va = kernel_tm.channel(i / 4);

                int k = 0;

                for (; k + 1 < K; k = k + 2)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum0 += (int)va[1] * vb[1];

                    sum1 += (int)va[2] * vb[0];
                    sum1 += (int)va[3] * vb[1];

                    sum2 += (int)va[4] * vb[0];
                    sum2 += (int)va[5] * vb[1];

                    sum3 += (int)va[6] * vb[0];
                    sum3 += (int)va[7] * vb[1];

                    va += 8;
                    vb += 2;
                }

                for (; k < K; k++)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum1 += (int)va[1] * vb[0];
                    sum2 += (int)va[2] * vb[0];
                    sum3 += (int)va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }

                output0[0] = (float)sum0 * scale_dequant0 + bias0;
                output1[0] = (float)sum1 * scale_dequant1 + bias1;
                output2[0] = (float)sum2 * scale_dequant2 + bias2;
                output3[0] = (float)sum3 * scale_dequant3 + bias3;

                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_outch_start; i < outch; i++)
        {
            float* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;
            const float scale_dequant0 = scale_dequant[i];

            int j = 0;
            for (; j + 3 < N; j = j + 4)
            {
                signed char* vb = bottom_tm.channel(j / 4);
                signed char* va = kernel_tm.channel(i / 4 + i % 4);
                int sum[4] = {0};

                int k = 0;
                for (; k + 1 < K; k = k + 2)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum[n] += (int)va[0] * vb[2 * n];
                        sum[n] += (int)va[1] * vb[2 * n + 1];
                    }
                    va += 2;
                    vb += 8;
                }

                for (; k < K; k++)
                {
                    for (int n = 0; n < 4; n++)
                    {
                        sum[n] += (int)va[0] * vb[n];
                    }
                    va += 1;
                    vb += 4;
                }

                for (int n = 0; n < 4; n++)
                {
                    output[n] = (float)sum[n] * scale_dequant0 + bias0;
                }
                output += 4;
            }

            for (; j < N; j++)
            {
                int sum = 0;

                signed char* vb = bottom_tm.channel(j / 4 + j % 4);
                signed char* va = kernel_tm.channel(i / 4 + i % 4);

                for (int k = 0; k < K; k++)
                {
                    sum += (int)va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = (float)sum * scale_dequant0 + bias0;

                output++;
            }
        }
    }

    // // sgemm(int M, int N, int K, float* A, float* B, float* C)
    // {
    //     for (int i=0; i<M; i++)
    //     {
    //         int* output = top_blob.channel(i);

    //         for (int j=0; j<N; j++)
    //         {
    //             int sum = 0;

    //             signed char* vb = (signed char*)bottom_im2row + K * j;
    //             const signed char* va = kernel + K * i;

    //             for (int k=0; k<K; k++)
    //             {
    //                 sum += (int)va[0] * vb[0];

    //                 va += 1;
    //                 vb += 1;
    //             }
    //             output[0] = sum;

    //             output++;
    //         }
    //     }
    // }
}